

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O2

char * flatcc_json_parser_skip_constant(flatcc_json_parser_t *ctx,char *buf,char *end)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  
  do {
    while( true ) {
      if (buf == end) {
        return (char *)(byte *)buf;
      }
      bVar1 = *buf;
      if (((bVar1 != 0x5f && -1 < (char)bVar1) && (bVar1 != 0x2e && 9 < (byte)(bVar1 - 0x30))) &&
         (0x19 < (byte)((bVar1 | 0x20) + 0x9f))) break;
      buf = (char *)((byte *)buf + 1);
    }
    pbVar2 = (byte *)flatcc_json_parser_space(ctx,buf,end);
    bVar3 = pbVar2 != (byte *)buf;
    buf = (char *)pbVar2;
  } while (bVar3);
  return (char *)pbVar2;
}

Assistant:

const char *flatcc_json_parser_skip_constant(flatcc_json_parser_t *ctx, const char *buf, const char *end)
{
    char c;
    const char *k;

    while (buf != end) {
        c = *buf;
        if ((c & 0x80) || (c == '_') || (c >= '0' && c <= '9') || c == '.') {
            ++buf;
            continue;
        }
        /* Upper case. */
        c |= 0x20;
        if (c >= 'a' && c <= 'z') {
            ++buf;
            continue;
        }
        buf = flatcc_json_parser_space(ctx, (k = buf), end);
        if (buf == k) {
            return buf;
        }
    }
    return buf;
}